

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_classifier.cpp
# Opt level: O0

istream * operator>>(istream *s,Am_Gesture_Classifier *cl)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  Gesture_Class *this;
  istream *piVar5;
  Vector pdVar6;
  Matrix ppdVar7;
  ostream *this_00;
  Vector v_1;
  Vector v;
  char local_a1;
  int local_a0;
  int iStack_9c;
  char check;
  int i;
  int ver;
  Gesture_Class *classes;
  Am_Gesture_Classifier_Data *cldata;
  char buf [100];
  int n;
  Am_Gesture_Classifier *cl_local;
  istream *s_local;
  
  classes = (Gesture_Class *)0x0;
  unique0x1000042b = cl;
  std::istream::get((char *)s,(long)&cldata,'d');
  plVar3 = (long *)std::istream::get((char *)s);
  uVar4 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if (((uVar4 & 1) == 0) && (local_a1 == '\n')) {
    for (iStack_9c = 0; version_messages[iStack_9c] != (char *)0x0; iStack_9c = iStack_9c + 1) {
      iVar2 = strcmp((char *)&cldata,version_messages[iStack_9c]);
      if (iVar2 == 0) {
        std::istream::operator>>(s,(int *)(buf + 0x5c));
        std::istream::get((char *)s,(long)&cldata,'d');
        plVar3 = (long *)std::istream::get((char *)s);
        uVar4 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
        if ((((uVar4 & 1) == 0) && (local_a1 == '\n')) &&
           (iVar2 = strcmp((char *)&cldata," classes"), iVar2 == 0)) {
          this = (Gesture_Class *)operator_new(0x28);
          Am_Gesture_Classifier_Data::Am_Gesture_Classifier_Data
                    ((Am_Gesture_Classifier_Data *)this,buf._92_4_);
          _i = (Gesture_Class *)this->average;
          local_a0 = 0;
          classes = this;
          goto LAB_00218dfc;
        }
        break;
      }
    }
  }
LAB_00219142:
  this_00 = std::operator<<((ostream *)&std::cerr,"unrecognized gesture classifier format");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ios::clear((int)s + (int)*(undefined8 *)(*(long *)s + -0x18));
  return s;
LAB_00218dfc:
  if ((int)buf._92_4_ <= local_a0) goto LAB_00218ea6;
  std::istream::get((char *)s,(long)&cldata);
  plVar3 = (long *)std::istream::get((char *)s);
  uVar4 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if (((uVar4 & 1) != 0) || (local_a1 != '\n')) goto LAB_00219142;
  Am_String::operator=(&_i[local_a0].name,(char *)&cldata);
  local_a0 = local_a0 + 1;
  goto LAB_00218dfc;
LAB_00218ea6:
  piVar5 = std::operator>>(s,&local_a1);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
  if ((bVar1) && (local_a1 == 'V')) {
    std::istream::putback((char)s);
    for (local_a0 = 0; local_a0 < (int)buf._92_4_; local_a0 = local_a0 + 1) {
      pdVar6 = InputVector(s);
      _i[local_a0].average = pdVar6;
      pdVar6 = InputVector(s);
      _i[local_a0].w = pdVar6;
    }
    pdVar6 = InputVector(s);
    for (local_a0 = 0; local_a0 < (int)buf._92_4_; local_a0 = local_a0 + 1) {
      _i[local_a0].cnst = pdVar6[local_a0];
    }
    FreeVector(pdVar6);
    if (iStack_9c < 1) {
      for (local_a0 = 0; local_a0 < (int)buf._92_4_; local_a0 = local_a0 + 1) {
        _i[local_a0].is_dot = false;
      }
    }
    else {
      pdVar6 = InputVector(s);
      for (local_a0 = 0; local_a0 < (int)buf._92_4_; local_a0 = local_a0 + 1) {
        _i[local_a0].is_dot = pdVar6[local_a0] != 0.0;
      }
      FreeVector(pdVar6);
    }
    ppdVar7 = InputMatrix(s);
    classes->cnst = (double)ppdVar7;
    *(undefined1 *)&classes->w = 1;
  }
  else {
    bVar1 = std::ios::operator_cast_to_bool((ios *)(s + *(long *)(*(long *)s + -0x18)));
    if (bVar1) {
      std::istream::putback((char)s);
    }
    else {
      std::ios::clear((int)s + (int)*(undefined8 *)(*(long *)s + -0x18));
    }
  }
  uVar4 = std::ios::operator!((ios *)(s + *(long *)(*(long *)s + -0x18)));
  if ((uVar4 & 1) == 0) {
    if (stack0xffffffffffffffe0->data != (Am_Gesture_Classifier_Data *)0x0) {
      Am_Wrapper::Release(&stack0xffffffffffffffe0->data->super_Am_Wrapper);
    }
    stack0xffffffffffffffe0->data = (Am_Gesture_Classifier_Data *)classes;
    return s;
  }
  goto LAB_00219142;
}

Assistant:

std::istream &
operator>>(std::istream &s, Am_Gesture_Classifier &cl)
{
  int n;
  char buf[100];
  Am_Gesture_Classifier_Data *cldata = nullptr;
  Am_Gesture_Classifier_Data::Gesture_Class *classes;
  int ver;
  int i;
  char check;

  // First check gesture version

  s.get(buf, sizeof(buf), '\n');
  if (!s.get(check) || check != '\n')
    goto lFail;

  for (ver = 0;; ++ver)
    if (!version_messages[ver])
      goto lFail;
    else if (!strcmp(buf, version_messages[ver]))
      break;

  // Classifier and trainer formats both begin with a class list.  E.g.:
  //
  //   3 classes
  //   cut
  //   copy
  //   paste

  s >> n;
  s.get(buf, sizeof(buf), '\n');

  if (!s.get(check) || check != '\n' || strcmp(buf, " classes"))
    goto lFail;

  // construct a new classifier with n classes
  cldata = new Am_Gesture_Classifier_Data(n);
  classes = cldata->classes;

  //AM_TRACE(n << " classes " <<std::flush);
  for (i = 0; i < n; i++) {
    s.get(buf, sizeof(buf));
    if (!s.get(check) || check != '\n')
      // class name too long
      goto lFail;
    classes[i].name = buf;
    //AM_TRACE(buf << " " <<std::flush);
  }
  //AM_TRACE(endl);

  // Now look for weights, constants, covariance matrix.
  // Weight vector begins with 'V'.  If we don't find it, assume
  // we have an untrained classifier (i.e., just a list of classes).

  if (s >> check && check == 'V') {
    s.putback(check);

    for (i = 0; i < n; i++) {
      classes[i].average = InputVector(s);
      classes[i].w = InputVector(s);
    }

    Vector v = InputVector(s);
    for (i = 0; i < n; i++)
      classes[i].cnst = v[i];
    FreeVector(v);

    if (ver > NO_DOT_VERSION) {
      Vector v = InputVector(s);
      // read in is_dot fields for each class
      for (i = 0; i < n; ++i)
        classes[i].is_dot = (v[i] != 0.0);
      FreeVector(v);
    } else {
      // initialize all is_dot fields
      for (i = 0; i < n; ++i)
        classes[i].is_dot = false;
    }

    cldata->invavgcov = InputMatrix(s);

    cldata->trained = true;
  } else if (s)
    s.putback(check);
  else
    s.clear(std::ios::goodbit);

  if (!s)
    goto lFail;

  if (cl.data)
    cl.data->Release();
  cl.data = cldata;
  return s;

lFail:
  std::cerr << "unrecognized gesture classifier format" << std::endl;
  s.clear(std::ios::badbit);
  return s;
}